

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_6b65cb::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  __type _Var4;
  char *pcVar5;
  string *this;
  cmMakefile *this_00;
  string_view value;
  string e;
  string e_1;
  cmAlphaNum local_60;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"sub-command COMPARE requires a mode to be specified.",
               (allocator<char> *)&local_60);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __lhs = pbVar1 + 1;
    bVar3 = std::operator==(__lhs,"EQUAL");
    if ((((bVar3) || (bVar3 = std::operator==(__lhs,"NOTEQUAL"), bVar3)) ||
        (bVar3 = std::operator==(__lhs,"LESS"), bVar3)) ||
       (((bVar3 = std::operator==(__lhs,"LESS_EQUAL"), bVar3 ||
         (bVar3 = std::operator==(__lhs,"GREATER"), bVar3)) ||
        (bVar3 = std::operator==(__lhs,"GREATER_EQUAL"), bVar3)))) {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
        e._M_dataplus._M_p = &DAT_0000001a;
        e._M_string_length = (size_type)anon_var_dwarf_6b63fd;
        local_60.View_._M_str = pbVar1[1]._M_dataplus._M_p;
        local_60.View_._M_len = pbVar1[1]._M_string_length;
        cmStrCat<char[46]>(&e_1,(cmAlphaNum *)&e,&local_60,(char (*) [46])0x581dd6);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        this = &e_1;
        goto LAB_00202f70;
      }
      __lhs_00 = pbVar2 + 2;
      __rhs = pbVar2 + 3;
      bVar3 = std::operator==(__lhs,"LESS");
      if (bVar3) {
        bVar3 = std::operator<(__lhs_00,__rhs);
LAB_00203006:
        if (bVar3 != false) {
LAB_0020300a:
          this_00 = status->Makefile;
          pcVar5 = "1";
          goto LAB_00203041;
        }
      }
      else {
        bVar3 = std::operator==(__lhs,"LESS_EQUAL");
        if (bVar3) {
          bVar3 = std::operator<=(__lhs_00,__rhs);
          goto LAB_00203006;
        }
        bVar3 = std::operator==(__lhs,"GREATER");
        if (bVar3) {
          bVar3 = std::operator>(__lhs_00,__rhs);
          goto LAB_00203006;
        }
        bVar3 = std::operator==(__lhs,"GREATER_EQUAL");
        if (bVar3) {
          bVar3 = std::operator>=(__lhs_00,__rhs);
          goto LAB_00203006;
        }
        bVar3 = std::operator==(__lhs,"EQUAL");
        _Var4 = std::operator==(__lhs_00,__rhs);
        if (bVar3 == _Var4) goto LAB_0020300a;
      }
      this_00 = status->Makefile;
      pcVar5 = "0";
LAB_00203041:
      value._M_str = pcVar5;
      value._M_len = 1;
      cmMakefile::AddDefinition(this_00,pbVar2 + 4,value);
      return true;
    }
    std::operator+(&e,"sub-command COMPARE does not recognize mode ",__lhs);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  this = &e;
LAB_00202f70:
  std::__cxx11::string::~string((string *)this);
  return false;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("COMPARE must be called with four arguments.");
    return false;
  }

  static std::map<cm::string_view,
                  std::function<bool(const cmCMakePath&,
                                     const cmCMakePath&)>> const operators{
    { "EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 == path2;
      } },
    { "NOT_EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 != path2;
      } }
  };

  const auto op = operators.find(args[2]);
  if (op == operators.end()) {
    status.SetError(cmStrCat(
      "COMPARE called with an unknown comparison operator: ", args[2], "."));
    return false;
  }

  if (args[4].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path1(args[1]);
  cmCMakePath path2(args[3]);
  auto result = op->second(path1, path2);

  status.GetMakefile().AddDefinitionBool(args[4], result);

  return true;
}